

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

DescriptorNames __thiscall
google::protobuf::DescriptorBuilder::AllocateNameStrings
          (DescriptorBuilder *this,string_view scope,string_view proto_name,Message *entity,
          FlatAllocator *alloc)

{
  _Storage<google::protobuf::internal::DescriptorNames,_true> _Var1;
  size_t sVar2;
  size_t sVar3;
  AlphaNum *pAVar4;
  AlphaNum *c;
  string_view element_name;
  optional<google::protobuf::internal::DescriptorNames> oVar5;
  string_view name;
  undefined1 local_e0 [32];
  AlphaNum local_c0;
  AlphaNum local_90;
  size_t local_60;
  char *local_58;
  
  pAVar4 = (AlphaNum *)proto_name._M_str;
  sVar3 = scope._M_len;
  c = pAVar4;
  oVar5 = anon_unknown_24::
          FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          ::AllocateEntityNames
                    (&alloc->
                      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                     ,scope,proto_name);
  _Var1 = oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
          _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
          _M_payload;
  if (((undefined1  [16])
       oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames> &
      (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    sVar2 = proto_name._M_len;
    if (sVar3 != 0) {
      local_90.piece_._M_len = 1;
      local_90.piece_._M_str = ".";
      local_c0.piece_._M_len = proto_name._M_len;
      local_c0.piece_._M_str = (char *)pAVar4;
      local_60 = sVar3;
      local_58 = scope._M_str;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_e0,(lts_20250127 *)&local_60,&local_90,&local_c0,c);
      sVar2 = local_e0._8_8_;
      pAVar4 = (AlphaNum *)local_e0._0_8_;
    }
    element_name._M_str = (char *)pAVar4;
    element_name._M_len = sVar2;
    AddError(this,element_name,entity,NAME,"Name too long.");
    if ((sVar3 != 0) && ((AlphaNum *)local_e0._0_8_ != (AlphaNum *)(local_e0 + 0x10))) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
    }
    name._M_str = "unknown";
    name._M_len = 7;
    oVar5 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateEntityNames
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,(string_view)(ZEXT816(0x3b54fc) << 0x40),name);
    _Var1 = oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
            _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
            _M_payload;
    if (((undefined1  [16])
         oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
         _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames> &
        (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__throw_bad_optional_access();
    }
  }
  return (DescriptorNames)_Var1;
}

Assistant:

auto DescriptorBuilder::AllocateNameStrings(const absl::string_view scope,
                                            const absl::string_view proto_name,
                                            const Message& entity,
                                            internal::FlatAllocator& alloc) {
  if (auto names = alloc.AllocateEntityNames(scope, proto_name)) {
    return *names;
  }

  AddError(scope.empty() ? proto_name : absl::StrCat(scope, ".", proto_name),
           entity, DescriptorPool::ErrorCollector::NAME, "Name too long.");
  // Return any valid name for the caller to use and keep going.
  return alloc.AllocateEntityNames("", "unknown").value();
}